

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O2

bool __thiscall
sliding_puzzle::SlidingPuzzle::generateSuccessorForAction
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *current_state,int *anchor_location,char action
          ,SlidingPuzzleState *successor_state)

{
  long lVar1;
  pointer pvVar2;
  long *plVar3;
  int iVar4;
  undefined7 in_register_00000009;
  long lVar5;
  undefined4 *puVar6;
  long lVar7;
  
  iVar4 = (int)CONCAT71(in_register_00000009,action);
  if (iVar4 == 0x45) {
    if (anchor_location[1] == puzzle_size + -1) {
      return false;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=(&successor_state->state_,
                &((current_state->
                  super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->state_);
    lVar1 = (long)(((current_state->
                    super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->state_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (successor_state->state_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)
     (*(long *)&pvVar2[*anchor_location].super__Vector_base<int,_std::allocator<int>_>._M_impl + 4 +
     (long)anchor_location[1] * 4) =
         *(undefined4 *)
          (*(long *)(lVar1 + (long)*anchor_location * 0x18) + (long)anchor_location[1] * 4);
    lVar7 = (long)*anchor_location * 0x18;
    lVar5 = (long)anchor_location[1];
    puVar6 = (undefined4 *)(*(long *)(lVar1 + lVar7) + lVar5 * 4 + 4);
  }
  else {
    if (iVar4 != 0x57) {
      if (iVar4 == 0x53) {
        if (*anchor_location == puzzle_size + -1) {
          return false;
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&successor_state->state_,
                    &((current_state->
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->state_);
        lVar1 = (long)(((current_state->
                        super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->state_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (successor_state->state_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)
         (*(long *)&pvVar2[(long)*anchor_location + 1].super__Vector_base<int,_std::allocator<int>_>
                    ._M_impl + (long)anchor_location[1] * 4) =
             *(undefined4 *)
              (*(long *)(lVar1 + (long)*anchor_location * 0x18) + (long)anchor_location[1] * 4);
        lVar7 = (long)*anchor_location * 0x18;
        lVar5 = (long)anchor_location[1];
        puVar6 = (undefined4 *)(lVar5 * 4 + *(long *)(lVar1 + 0x18 + lVar7));
      }
      else {
        if (*anchor_location == 0) {
          return false;
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&successor_state->state_,
                    &((current_state->
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->state_);
        lVar1 = (long)(((current_state->
                        super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->state_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (successor_state->state_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)
         (*(long *)&pvVar2[(long)*anchor_location + -1].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl +
         (long)anchor_location[1] * 4) =
             *(undefined4 *)
              (*(long *)(lVar1 + (long)*anchor_location * 0x18) + (long)anchor_location[1] * 4);
        lVar7 = (long)*anchor_location * 0x18;
        lVar5 = (long)anchor_location[1];
        puVar6 = (undefined4 *)(lVar5 * 4 + *(long *)(lVar1 + -0x18 + lVar7));
      }
      plVar3 = (long *)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                       lVar7);
      goto LAB_00107ac4;
    }
    if (anchor_location[1] == 0) {
      return false;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=(&successor_state->state_,
                &((current_state->
                  super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->state_);
    lVar1 = (long)(((current_state->
                    super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->state_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (successor_state->state_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)
     (*(long *)&pvVar2[*anchor_location].super__Vector_base<int,_std::allocator<int>_>._M_impl + -4
     + (long)anchor_location[1] * 4) =
         *(undefined4 *)
          (*(long *)(lVar1 + (long)*anchor_location * 0x18) + (long)anchor_location[1] * 4);
    lVar7 = (long)*anchor_location * 0x18;
    lVar5 = (long)anchor_location[1];
    puVar6 = (undefined4 *)(*(long *)(lVar1 + lVar7) + lVar5 * 4 + -4);
  }
  plVar3 = (long *)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl + lVar7);
LAB_00107ac4:
  *(undefined4 *)(*plVar3 + lVar5 * 4) = *puVar6;
  return true;
}

Assistant:

bool SlidingPuzzle::generateSuccessorForAction(const SlidingPuzzleStatePtr& current_state,
                                               const int* anchor_location,
                                               const char action,
                                               SlidingPuzzleState& successor_state)
{

  switch(action)
  {
    case 'N':
      if (anchor_location[0]==0)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]-1][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]-1][anchor_location[1]];
        return true;
      }
    case 'E':
      if (anchor_location[1]==puzzle_size-1)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]][anchor_location[1]+1] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]+1];
        return true;
      }
    case 'W':
      if (anchor_location[1]==0)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]][anchor_location[1]-1] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]-1];
        return true;
      }
    case 'S':
      if (anchor_location[0]==puzzle_size-1)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]+1][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]+1][anchor_location[1]];
        return true;
      }
  }
}